

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O2

string * __thiscall
inja::Environment::load_file(string *__return_storage_ptr__,Environment *this,string *filename)

{
  path pStack_1f8;
  path local_1d0;
  Parser parser;
  
  Parser::Parser(&parser,&this->parser_config,&this->lexer_config,&this->template_storage,
                 &this->function_storage);
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&pStack_1f8,filename,auto_format);
  std::filesystem::__cxx11::operator/(&local_1d0,&this->input_path,&pStack_1f8);
  Parser::load_file(__return_storage_ptr__,&local_1d0);
  std::filesystem::__cxx11::path::~path(&local_1d0);
  std::filesystem::__cxx11::path::~path(&pStack_1f8);
  Parser::~Parser(&parser);
  return __return_storage_ptr__;
}

Assistant:

std::string load_file(const std::string& filename) {
    Parser parser(parser_config, lexer_config, template_storage, function_storage);
    return Parser::load_file(input_path / filename);
  }